

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.cpp
# Opt level: O3

string * formatBytes_abi_cxx11_(string *__return_storage_ptr__,size_t bytes)

{
  size_t sVar1;
  char *__format;
  double dVar2;
  undefined1 auVar3 [16];
  char formatted [24];
  char acStack_58 [24];
  string local_40;
  
  if (bytes < 995000000) {
    if (bytes < 0xf2eb8) {
      if (bytes < 0x3e3) {
        snprintf(acStack_58,0x18,"%d B");
        goto LAB_00114351;
      }
      dVar2 = (double)(long)bytes / 1000.0;
      __format = "%.1f KiB";
    }
    else {
      dVar2 = (double)(long)bytes / 1000000.0;
      __format = "%.1f MiB";
    }
  }
  else {
    auVar3._8_4_ = (int)(bytes >> 0x20);
    auVar3._0_8_ = bytes;
    auVar3._12_4_ = 0x45300000;
    dVar2 = ((auVar3._8_8_ - 1.9342813113834067e+25) +
            ((double)CONCAT44(0x43300000,(int)bytes) - 4503599627370496.0)) / 1000000000.0;
    __format = "%.1f GiB";
  }
  snprintf(acStack_58,0x18,__format,dVar2);
LAB_00114351:
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  sVar1 = strlen(acStack_58);
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,acStack_58,acStack_58 + sVar1)
  ;
  commify(__return_storage_ptr__,&local_40);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string formatBytes (size_t bytes)
{
  char formatted[24];

       if (bytes >=  995000000) snprintf (formatted, sizeof(formatted), "%.1f GiB", bytes / 1000000000.0);
  else if (bytes >=     995000) snprintf (formatted, sizeof(formatted), "%.1f MiB", bytes /    1000000.0);
  else if (bytes >=        995) snprintf (formatted, sizeof(formatted), "%.1f KiB", bytes /       1000.0);
  else                          snprintf (formatted, sizeof(formatted), "%d B",     (int)bytes);

  return commify (formatted);
}